

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFInterpolater.cpp
# Opt level: O3

void __thiscall
amrex::MFPCInterp::interp
          (MFPCInterp *this,MultiFab *crsemf,int ccomp,MultiFab *finemf,int fcomp,int nc,IntVect *ng
          ,Geometry *param_7,Geometry *param_8,Box *dest_domain,IntVect *ratio,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *param_11,int param_12)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  double *pdVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  double *pdVar19;
  bool bVar20;
  MFIter mfi;
  ulong local_1c0;
  long local_1a8;
  Box local_12c;
  Array4<const_double> local_110;
  Array4<double> local_d0;
  MFIter local_90;
  
  MFIter::MFIter(&local_90,(FabArrayBase *)finemf,'\0');
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_d0,&finemf->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_110,&crsemf->super_FabArray<amrex::FArrayBox>,&local_90);
      BATransformer::operator()
                (&local_12c,&((local_90.fabArray)->boxarray).m_bat,
                 (Box *)((long)((local_90.index_map)->super_vector<int,_std::allocator<int>_>).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[local_90.currentIndex] * 0x1c +
                        *(long *)&((((local_90.fabArray)->boxarray).m_ref.
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      uVar9 = local_12c.smallend.vect[2] - ng->vect[2];
      uVar2 = (dest_domain->smallend).vect[2];
      if ((int)uVar9 <= (int)uVar2) {
        uVar9 = uVar2;
      }
      if (0 < nc) {
        uVar10 = ng->vect[2] + local_12c.bigend.vect[2];
        uVar2 = (dest_domain->bigend).vect[2];
        if ((int)uVar2 <= (int)uVar10) {
          uVar10 = uVar2;
        }
        uVar2 = (dest_domain->smallend).vect[0];
        iVar15 = local_12c.smallend.vect[1] - ng->vect[1];
        iVar18 = ng->vect[1] + local_12c.bigend.vect[1];
        iVar3 = (dest_domain->bigend).vect[1];
        if (iVar3 <= iVar18) {
          iVar18 = iVar3;
        }
        iVar3 = (dest_domain->smallend).vect[1];
        uVar13 = local_12c.smallend.vect[0] - ng->vect[0];
        iVar17 = ng->vect[0] + local_12c.bigend.vect[0];
        iVar4 = (dest_domain->bigend).vect[0];
        if (iVar4 <= iVar17) {
          iVar17 = iVar4;
        }
        if (iVar15 <= iVar3) {
          iVar15 = iVar3;
        }
        if ((int)uVar13 <= (int)uVar2) {
          uVar13 = uVar2;
        }
        iVar3 = ratio->vect[2];
        local_1c0 = 0;
        local_1a8 = (long)fcomp << 3;
        do {
          if ((int)uVar9 <= (int)uVar10) {
            iVar4 = ratio->vect[1];
            uVar2 = uVar9;
            do {
              uVar6 = uVar2;
              if (iVar3 != 1) {
                if (iVar3 == 4) {
                  if ((int)uVar2 < 0) {
                    uVar6 = (int)uVar2 >> 2;
                  }
                  else {
                    uVar6 = uVar2 >> 2;
                  }
                }
                else if (iVar3 == 2) {
                  if ((int)uVar2 < 0) {
                    uVar6 = (int)uVar2 >> 1;
                  }
                  else {
                    uVar6 = uVar2 >> 1;
                  }
                }
                else if ((int)uVar2 < 0) {
                  uVar6 = ~((int)~uVar2 / iVar3);
                }
                else {
                  uVar6 = (int)uVar2 / iVar3;
                }
              }
              if (iVar15 <= iVar18) {
                iVar5 = ratio->vect[0];
                pdVar19 = (double *)
                          ((long)local_d0.p +
                          local_d0.nstride * local_1a8 +
                          ((long)iVar15 - (long)local_d0.begin.y) * local_d0.jstride * 8 +
                          ((long)(int)uVar2 - (long)local_d0.begin.z) * local_d0.kstride * 8 +
                          (long)local_d0.begin.x * -8 + (long)(int)uVar13 * 8);
                uVar14 = (long)iVar15;
                do {
                  uVar7 = (uint)uVar14;
                  if (iVar4 != 1) {
                    if (iVar4 == 4) {
                      if ((long)uVar14 < 0) {
                        uVar7 = (int)uVar7 >> 2;
                      }
                      else {
                        uVar7 = uVar7 >> 2;
                      }
                    }
                    else if (iVar4 == 2) {
                      if ((long)uVar14 < 0) {
                        uVar7 = (int)uVar7 >> 1;
                      }
                      else {
                        uVar7 = (uint)(uVar14 >> 1) & 0x7fffffff;
                      }
                    }
                    else if ((long)uVar14 < 0) {
                      uVar7 = ~((int)~uVar7 / iVar4);
                    }
                    else {
                      uVar7 = (uint)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 |
                                           uVar14 & 0xffffffff) / (long)iVar4);
                    }
                  }
                  if ((int)uVar13 <= iVar17) {
                    pdVar12 = pdVar19;
                    uVar16 = (long)(int)uVar13;
                    uVar11 = ~uVar13;
                    do {
                      uVar8 = (uint)uVar16;
                      if (iVar5 == 4) {
                        if ((long)uVar16 < 0) {
                          uVar8 = (int)uVar8 >> 2;
                        }
                        else {
                          uVar8 = uVar8 >> 2;
                        }
                      }
                      else if (iVar5 == 2) {
                        if ((long)uVar16 < 0) {
                          uVar8 = (int)uVar8 >> 1;
                        }
                        else {
                          uVar8 = uVar8 >> 1;
                        }
                      }
                      else if (iVar5 != 1) {
                        if ((long)uVar16 < 0) {
                          uVar8 = ~((int)uVar11 / iVar5);
                        }
                        else {
                          uVar8 = (uint)((long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 |
                                               uVar16 & 0xffffffff) / (long)iVar5);
                        }
                      }
                      *pdVar12 = local_110.p
                                 [((long)(int)uVar6 - (long)local_110.begin.z) * local_110.kstride +
                                  local_110.nstride * ((long)ccomp + local_1c0) +
                                  ((long)(int)uVar7 - (long)local_110.begin.y) * local_110.jstride +
                                  ((long)(int)uVar8 - (long)local_110.begin.x)];
                      uVar16 = uVar16 + 1;
                      pdVar12 = pdVar12 + 1;
                      iVar1 = iVar17 + 1 + uVar11;
                      uVar11 = uVar11 - 1;
                    } while (iVar1 != 0);
                  }
                  uVar14 = uVar14 + 1;
                  pdVar19 = pdVar19 + local_d0.jstride;
                } while (iVar18 + 1 != (int)uVar14);
              }
              bVar20 = uVar2 != uVar10;
              uVar2 = uVar2 + 1;
            } while (bVar20);
          }
          local_1c0 = local_1c0 + 1;
          local_1a8 = local_1a8 + 8;
        } while (local_1c0 != (uint)nc);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
MFPCInterp::interp (MultiFab const& crsemf, int ccomp, MultiFab& finemf, int fcomp, int nc,
                    IntVect const& ng, Geometry const&, Geometry const&,
                    Box const& dest_domain, IntVect const& ratio,
                    Vector<BCRec> const&, int)
{
    AMREX_ASSERT(crsemf.nGrowVect() == 0);

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto const& crse = crsemf.const_arrays();
        auto const& fine = finemf.arrays();
        ParallelFor(finemf, ng, nc,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            if (dest_domain.contains(i,j,k)) {
                AMREX_D_TERM(int ic = amrex::coarsen(i,ratio[0]);,
                             int jc = amrex::coarsen(j,ratio[1]);,
                             int kc = amrex::coarsen(k,ratio[2]);)
                AMREX_D_PICK(fine[box_no](i,0,0,n+fcomp) = crse[box_no](ic, 0, 0,n+ccomp);,
                             fine[box_no](i,j,0,n+fcomp) = crse[box_no](ic,jc, 0,n+ccomp);,
                             fine[box_no](i,j,k,n+fcomp) = crse[box_no](ic,jc,kc,n+ccomp);)
            }
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(finemf); mfi.isValid(); ++mfi) {
            auto const& fine = finemf.array(mfi);
            auto const& crse = crsemf.const_array(mfi);
            Box const& fbox = amrex::grow(mfi.validbox(), ng) & dest_domain;
            pcinterp_interp(fbox, fine, fcomp, nc, crse, ccomp, ratio);
        }
    }
}